

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

void free_block_definition(BlockDefinition *block_definition)

{
  BlockDefinitionType BVar1;
  ForBlockDefinition *for_block_definition;
  Expression *expression;
  ulong uVar2;
  
  BVar1 = block_definition->block_definition_type;
  if (BVar1 == BlockDefinitionTypeIfBlock) {
    free_expression(*(Expression **)(block_definition + 6));
    expression = *(Expression **)(block_definition + 4);
  }
  else {
    if (BVar1 != BlockDefinitionTypeForBlock) {
      if (BVar1 != BlockDefinitionTypeIfElseGroupBlock) {
        return;
      }
      if (*(long *)(block_definition + 2) != 0) {
        uVar2 = 0;
        do {
          free_block_definition(*(BlockDefinition **)(*(long *)(block_definition + 4) + uVar2 * 8));
          uVar2 = uVar2 + 1;
        } while (uVar2 < *(ulong *)(block_definition + 2));
      }
      free(*(void **)(block_definition + 4));
      if (*(BlockDefinition **)(block_definition + 6) != (BlockDefinition *)0x0) {
        free_block_definition(*(BlockDefinition **)(block_definition + 6));
      }
      goto LAB_001057f4;
    }
    free_expression(*(Expression **)(block_definition + 6));
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      free_expression(*(Expression **)(block_definition + 4));
    }
    expression = *(Expression **)(block_definition + 8);
  }
  if (expression != (Expression *)0x0) {
    free_expression(expression);
  }
  free_block(*(Block **)(block_definition + 2));
LAB_001057f4:
  free(block_definition);
  return;
}

Assistant:

void free_block_definition(BlockDefinition *block_definition) {
  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *)block_definition;

      for (size_t i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        free_block_definition((BlockDefinition *) if_else_group_block_definition->if_block_definitions[i]);
      }
      free(if_else_group_block_definition->if_block_definitions);

      if (if_else_group_block_definition->else_block_definition) free_block_definition((BlockDefinition *) if_else_group_block_definition->else_block_definition);
      free(if_else_group_block_definition);

      break;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *)block_definition;

      free_expression(if_block_definition->condition);
      if (if_block_definition->pre_expression != NULL) free_expression(if_block_definition->pre_expression);
      free_block(if_block_definition->block);
      free(if_block_definition);

      break;
    }

    case BlockDefinitionTypeElseBlock: {
      break;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *)block_definition;

      free_expression(for_block_definition->condition);
      if (for_block_definition->pre_expression != NULL) free_expression(for_block_definition->pre_expression);
      if (for_block_definition->post_expression != NULL) free_expression(for_block_definition->post_expression);
      free_block(for_block_definition->block);
      free(for_block_definition);

      break;
    }

    default : {

    }
  }
}